

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  unsigned_short uVar2;
  int iVar3;
  ulong uVar4;
  long in_RCX;
  ulong uVar5;
  uint in_EDX;
  ulong uVar6;
  uint uVar7;
  uint i_1;
  vector<unsigned_short> sym_freq16;
  
  vector<unsigned_short>::vector(&sym_freq16,in_EDX);
  uVar6 = (ulong)in_EDX;
  uVar7 = 0;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = *(uint *)(in_RCX + uVar4 * 4);
    if (uVar7 <= uVar1) {
      uVar7 = uVar1;
    }
  }
  if (uVar7 == 0) {
    iVar3 = 0;
  }
  else {
    if (uVar7 < 0x10000) {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        sym_freq16.m_p[uVar4] = *(unsigned_short *)(in_RCX + uVar4 * 4);
      }
    }
    else {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        uVar5 = (ulong)*(uint *)(in_RCX + uVar4 * 4);
        if (uVar5 != 0) {
          uVar5 = uVar5 * 0xffff + (ulong)(uVar7 >> 1);
          uVar2 = (unsigned_short)(uVar5 / uVar7);
          if (uVar5 < uVar7) {
            uVar2 = 1;
          }
          sym_freq16.m_p[uVar4] = uVar2;
        }
      }
    }
    iVar3 = init(this,(EVP_PKEY_CTX *)((ulong)ctx & 0xff));
  }
  vector<unsigned_short>::~vector(&sym_freq16);
  return iVar3;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint* pSym_freq, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        crnlib::vector<uint16> sym_freq16(total_syms);

        uint max_freq = 0;
        for (uint i = 0; i < total_syms; i++)
        {
            max_freq = math::maximum(max_freq, pSym_freq[i]);
        }

        if (!max_freq)
        {
            return false;
        }

        if (max_freq <= cUINT16_MAX)
        {
            for (uint i = 0; i < total_syms; i++)
            {
                sym_freq16[i] = static_cast<uint16>(pSym_freq[i]);
            }
        }
        else
        {
            for (uint i = 0; i < total_syms; i++)
            {
                uint f = pSym_freq[i];
                if (!f)
                {
                    continue;
                }

                uint64 fl = f;

                fl = ((fl << 16) - fl) + (max_freq >> 1);
                fl /= max_freq;
                if (fl < 1)
                {
                    fl = 1;
                }

                CRNLIB_ASSERT(fl <= cUINT16_MAX);

                sym_freq16[i] = static_cast<uint16>(fl);
            }
        }

        return init(encoding, total_syms, &sym_freq16[0], code_size_limit);
    }